

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O3

int cmp_key_option_proxy_long(void *key,void *item)

{
  code *pcVar1;
  char *pcVar2;
  char *__s;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  
  if (key == (void *)0x0) {
    __assert_fail("longName != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                  ,0xb7,"int cmp_key_option_proxy_long(const void *, const void *)");
  }
  if (item == (void *)0x0) {
    __assert_fail("op != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                  ,0xb8,"int cmp_key_option_proxy_long(const void *, const void *)");
  }
  if (*item == 0) {
    __assert_fail("op->option != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                  ,0xb9,"int cmp_key_option_proxy_long(const void *, const void *)");
  }
  if (*(long *)((long)item + 8) != 0) {
    pcVar1 = *(code **)(*(long *)((long)item + 8) + 0x58);
    if (pcVar1 != (code *)0x0) {
      pcVar2 = *key;
      __s = *(char **)(*item + 8);
      if (pcVar2 == __s) {
        uVar3 = 0;
      }
      else {
        uVar3 = 0xffffffff;
        if (pcVar2 != (char *)0x0) {
          if (__s == (char *)0x0) {
            uVar3 = 1;
          }
          else {
            sVar4 = strlen(__s);
            uVar5 = *(ulong *)((long)key + 8);
            if (sVar4 <= *(ulong *)((long)key + 8)) {
              uVar5 = sVar4;
            }
            uVar3 = (*pcVar1)(pcVar2,__s,uVar5);
            if (uVar3 == 0) {
              uVar3 = 0xffffffff;
              if (sVar4 <= *(ulong *)((long)key + 8)) {
                uVar3 = (uint)(sVar4 < *(ulong *)((long)key + 8));
              }
            }
          }
        }
      }
      return uVar3;
    }
    __assert_fail("op->context->ncmpstr != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                  ,0xbb,"int cmp_key_option_proxy_long(const void *, const void *)");
  }
  __assert_fail("op->context != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c",
                0xba,"int cmp_key_option_proxy_long(const void *, const void *)");
}

Assistant:

static int
cmp_key_option_proxy_long(const void* key, const void* item)
{
    const char_array* longName = key;
    const option_proxy* op = item;

    size_t optionLen;
    int ret;

    assert(longName != NULL);
    assert(op != NULL);
    assert(op->option != NULL);
    assert(op->context != NULL);
    assert(op->context->ncmpstr != NULL);

    if (longName->s == op->option->long_name)
    {
        return 0;
    }
    else if (longName->s == NULL)
    {
        return -1;
    }
    else if (op->option->long_name == NULL)
    {
        return +1;
    }

    /* Although the `longName` key might not be `NUL`-terminated, the
     * `option_proxy` item we're searching against must be.
     */
    optionLen = dropt_strlen(op->option->long_name);
    ret = op->context->ncmpstr(longName->s,
                               op->option->long_name,
                               MIN(longName->len, optionLen));
    if (ret != 0)
    {
        return ret;
    }

    if (longName->len < optionLen)
    {
        return -1;
    }
    else if (longName->len > optionLen)
    {
        return +1;
    }

    return 0;
}